

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string * __thiscall crnlib::dynamic_string::set_char(dynamic_string *this,uint index,char c)

{
  uint7 in_register_00000011;
  char c_local;
  uint index_local;
  dynamic_string *this_local;
  
  if (c == '\0') {
    truncate(this,(char *)(ulong)index,(ulong)in_register_00000011 << 8);
  }
  else if (index < this->m_len) {
    this->m_pStr[index] = c;
    check(this);
  }
  else if (index == this->m_len) {
    append_char(this,c);
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::set_char(uint index, char c)
    {
        CRNLIB_ASSERT(index <= m_len);

        if (!c)
        {
            truncate(index);
        }
        else if (index < m_len)
        {
            m_pStr[index] = c;

            check();
        }
        else if (index == m_len)
        {
            append_char(c);
        }

        return *this;
    }